

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O2

void __thiscall Liby::UdpSocket::handleErroEvent(UdpSocket *this)

{
  shared_ptr<Liby::UdpSocket> self;
  __shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2> _Stack_18;
  
  std::__shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_18,
             &(this->self_).super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>);
  if ((this->erroEventCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(Liby::UdpSocket_&)>::operator()(&this->erroEventCallback_,this);
  }
  destroy(this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_18._M_refcount);
  return;
}

Assistant:

void UdpSocket::handleErroEvent() {
    auto self = self_;
    if (erroEventCallback_) {
        erroEventCallback_(*this);
    }
    destroy();
}